

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O3

void CreateBackwardReferencesNH54
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  ulong uVar1;
  uint8_t *puVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  size_t sVar8;
  ulong uVar9;
  ushort uVar10;
  uint uVar11;
  ushort uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint8_t *puVar16;
  long lVar17;
  uint8_t *puVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  byte bVar23;
  uint uVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  int iVar32;
  long lVar33;
  uint8_t *puVar34;
  ulong uVar35;
  ulong uVar36;
  uint8_t uVar37;
  size_t sVar38;
  ulong uVar39;
  int iVar40;
  long lVar41;
  uint8_t *puVar42;
  ulong local_128;
  ulong local_120;
  size_t *local_118;
  ulong local_110;
  ulong local_f8;
  ulong local_d8;
  ulong auStack_58 [5];
  
  uVar5 = (position - 7) + num_bytes;
  sVar38 = position;
  if (7 < num_bytes) {
    sVar38 = uVar5;
  }
  lVar41 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    lVar41 = 0x40;
  }
  local_128 = *(ulong *)dist_cache;
  uVar1 = position + num_bytes;
  if (uVar1 <= position + 8) {
    local_118 = last_insert_len;
LAB_003144c6:
    *(ulong *)dist_cache = (local_128 + uVar1) - position;
    *(long *)commands = *(long *)commands + ((long)local_118 - (long)last_insert_len >> 4);
    return;
  }
  uVar35 = (1L << (literal_context_lut[8] & 0x3f)) - 0x10;
  lVar6 = *(long *)(literal_context_lut + 0x10);
  lVar7 = *(long *)(literal_context_lut + 0x60);
  local_120 = lVar41 + position;
  sVar8 = (params->dictionary).compound.num_chunks;
  uVar11 = (uint)ringbuffer_mask;
  lVar4 = position - 1;
  local_118 = last_insert_len;
  uVar22 = position;
LAB_00313a21:
  uVar30 = uVar1 - uVar22;
  uVar19 = uVar35;
  if (uVar22 < uVar35) {
    uVar19 = uVar22;
  }
  uVar39 = uVar22 & ringbuffer_mask;
  puVar2 = ringbuffer + uVar39;
  uVar37 = ringbuffer[uVar39];
  local_d8 = (ulong)*(int *)(hasher->common).extra;
  local_f8 = 0x7e4;
  if ((uVar22 - local_d8 < uVar22) &&
     (uVar13 = (uint)(uVar22 - local_d8) & uVar11, uVar37 == ringbuffer[uVar13])) {
    puVar16 = ringbuffer + uVar13;
    uVar26 = uVar30;
    puVar34 = puVar16;
    puVar42 = puVar2;
    if (7 < uVar30) {
      lVar33 = 0;
      lVar25 = 0;
LAB_00313a8e:
      if (*(ulong *)(puVar2 + lVar33) == *(ulong *)(puVar16 + lVar33)) goto code_r0x00313a9b;
      uVar27 = *(ulong *)(puVar16 + lVar33) ^ *(ulong *)(puVar2 + lVar33);
      uVar26 = 0;
      if (uVar27 != 0) {
        for (; (uVar27 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
        }
      }
      uVar26 = (uVar26 >> 3 & 0x1fffffff) - lVar25;
      goto LAB_00313b13;
    }
    goto LAB_00313ac3;
  }
  goto LAB_00313b39;
code_r0x00313a9b:
  lVar33 = lVar33 + 8;
  lVar17 = uVar30 + lVar25;
  lVar25 = lVar25 + -8;
  if (lVar17 - 8U < 8) goto code_r0x00313ab1;
  goto LAB_00313a8e;
code_r0x00313ab1:
  puVar34 = puVar16 + -lVar25;
  puVar42 = puVar2 + -lVar25;
  uVar26 = lVar25 + uVar30;
LAB_00313ac3:
  if (uVar26 != 0) {
    uVar27 = 0;
    do {
      uVar28 = uVar27;
      if (puVar34[uVar27] != puVar42[uVar27]) break;
      uVar27 = uVar27 + 1;
      uVar28 = uVar26;
    } while (uVar26 != uVar27);
    puVar34 = puVar34 + uVar28;
  }
  uVar26 = (long)puVar34 - (long)puVar16;
LAB_00313b13:
  if ((uVar26 < 4) || (uVar27 = uVar26 * 0x87 + 0x78f, uVar27 < 0x7e5)) {
LAB_00313b39:
    local_d8 = 0;
    uVar26 = 0;
  }
  else {
    uVar37 = puVar2[uVar26];
    local_f8 = uVar27;
  }
  uVar13 = (uint)((ulong)(*(long *)(ringbuffer + uVar39) * -0x1ca5842ca8642d00) >> 0x2c);
  lVar17 = 0;
  lVar25 = 0;
  lVar33 = 1;
  do {
    auStack_58[lVar17] = lVar25 * 8 + (ulong)uVar13 & 0xfffff;
    auStack_58[lVar17 + 1] = lVar33 * 8 + (ulong)uVar13 & 0xfffff;
    lVar17 = lVar17 + 2;
    lVar25 = lVar25 + 2;
    lVar33 = lVar33 + 2;
  } while (lVar17 != 4);
  lVar25 = 0;
LAB_00313ba4:
  uVar13 = *(uint *)(sVar8 + auStack_58[lVar25] * 4);
  puVar34 = ringbuffer + (uVar11 & uVar13);
  if (((uVar37 == puVar34[uVar26]) && (uVar22 != uVar13)) &&
     (uVar39 = uVar22 - uVar13, uVar39 <= uVar19)) {
    puVar42 = puVar34;
    puVar16 = puVar2;
    uVar27 = uVar30;
    if (7 < uVar30) {
      lVar33 = 0;
      lVar17 = 0;
LAB_00313bfb:
      if (*(ulong *)(puVar2 + lVar33) == *(ulong *)(puVar34 + lVar33)) goto code_r0x00313c09;
      uVar28 = *(ulong *)(puVar34 + lVar33) ^ *(ulong *)(puVar2 + lVar33);
      uVar27 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
        }
      }
      uVar27 = (uVar27 >> 3 & 0x1fffffff) - lVar17;
      goto LAB_00313c65;
    }
    goto LAB_00313c2e;
  }
  goto LAB_00313ca0;
code_r0x00313c09:
  lVar33 = lVar33 + 8;
  lVar21 = uVar30 + lVar17;
  lVar17 = lVar17 + -8;
  if (lVar21 - 8U < 8) goto code_r0x00313c1f;
  goto LAB_00313bfb;
code_r0x00313c1f:
  puVar42 = puVar34 + -lVar17;
  puVar16 = puVar2 + -lVar17;
  uVar27 = lVar17 + uVar30;
LAB_00313c2e:
  puVar18 = puVar42;
  if (uVar27 != 0) {
    puVar18 = puVar42 + uVar27;
    uVar28 = 0;
    do {
      if (puVar42[uVar28] != puVar16[uVar28]) {
        puVar18 = puVar42 + uVar28;
        break;
      }
      uVar28 = uVar28 + 1;
    } while (uVar27 != uVar28);
  }
  uVar27 = (long)puVar18 - (long)puVar34;
LAB_00313c65:
  if (3 < uVar27) {
    iVar32 = 0x1f;
    if ((uint)uVar39 != 0) {
      for (; (uint)uVar39 >> iVar32 == 0; iVar32 = iVar32 + -1) {
      }
    }
    uVar28 = (ulong)(iVar32 * -0x1e + 0x780) + uVar27 * 0x87;
    if (local_f8 < uVar28) {
      uVar37 = puVar2[uVar27];
      uVar26 = uVar27;
      local_f8 = uVar28;
      local_d8 = uVar39;
    }
  }
LAB_00313ca0:
  lVar25 = lVar25 + 1;
  if (lVar25 == 4) goto code_r0x00313cad;
  goto LAB_00313ba4;
code_r0x00313cad:
  *(uint *)(sVar8 + *(long *)((long)auStack_58 + (ulong)((uint)uVar22 & 0x18)) * 4) = (uint)uVar22;
  if (0x7e4 < local_f8) {
    uVar19 = (ulong)*(int *)(hasher->common).extra;
    uVar39 = local_128 + 4;
    lVar25 = (lVar4 + num_bytes) - uVar22;
    iVar32 = 0;
LAB_00313d04:
    uVar30 = uVar30 - 1;
    uVar27 = uVar26 - 1;
    if (uVar30 <= uVar26 - 1) {
      uVar27 = uVar30;
    }
    if (4 < *(int *)(literal_context_lut + 4)) {
      uVar27 = 0;
    }
    uVar28 = uVar22 + 1;
    uVar36 = uVar35;
    if (uVar28 < uVar35) {
      uVar36 = uVar28;
    }
    puVar2 = ringbuffer + (uVar28 & ringbuffer_mask);
    uVar37 = puVar2[uVar27];
    uVar20 = uVar28 - uVar19;
    local_120 = 0x7e4;
    if ((uVar20 < uVar28) &&
       (puVar34 = ringbuffer + ((uint)uVar20 & uVar11), uVar37 == puVar34[uVar27])) {
      puVar42 = puVar2;
      uVar20 = uVar30;
      puVar16 = puVar34;
      if (7 < uVar30) {
        lVar33 = 0;
        lVar17 = 0;
LAB_00313d8f:
        if (*(ulong *)(puVar2 + lVar33) == *(ulong *)(puVar34 + lVar33)) goto code_r0x00313d9c;
        uVar31 = *(ulong *)(puVar34 + lVar33) ^ *(ulong *)(puVar2 + lVar33);
        uVar20 = 0;
        if (uVar31 != 0) {
          for (; (uVar31 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
          }
        }
        uVar20 = (uVar20 >> 3 & 0x1fffffff) - lVar17;
        goto LAB_00313e00;
      }
      goto LAB_00313dc1;
    }
    goto LAB_00313e33;
  }
  local_128 = local_128 + 1;
  position = uVar22 + 1;
  if (local_120 < position) {
    if ((uint)((int)lVar41 * 4) + local_120 < position) {
      uVar19 = uVar22 + 0x11;
      if (uVar5 <= uVar22 + 0x11) {
        uVar19 = uVar5;
      }
      for (; position < uVar19; position = position + 4) {
        *(uint *)(sVar8 + (ulong)((uint)((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)
                                                          ) * -0x1ca5842ca8642d00) >> 0x2c) +
                                  ((uint)position & 0x18) & 0xfffff) * 4) = (uint)position;
        local_128 = local_128 + 4;
      }
    }
    else {
      uVar19 = uVar22 + 9;
      if (uVar5 <= uVar22 + 9) {
        uVar19 = uVar5;
      }
      for (; position < uVar19; position = position + 2) {
        *(uint *)(sVar8 + (ulong)((uint)((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)
                                                          ) * -0x1ca5842ca8642d00) >> 0x2c) +
                                  ((uint)position & 0x18) & 0xfffff) * 4) = (uint)position;
        local_128 = local_128 + 2;
      }
    }
  }
  goto LAB_0031445d;
code_r0x00313d9c:
  lVar33 = lVar33 + 8;
  lVar21 = lVar25 + lVar17;
  lVar17 = lVar17 + -8;
  if (lVar21 - 8U < 8) goto code_r0x00313db2;
  goto LAB_00313d8f;
code_r0x00313db2:
  puVar16 = puVar34 + -lVar17;
  puVar42 = puVar2 + -lVar17;
  uVar20 = lVar17 + lVar25;
LAB_00313dc1:
  if (uVar20 != 0) {
    uVar31 = 0;
    do {
      uVar29 = uVar31;
      if (puVar16[uVar31] != puVar42[uVar31]) break;
      uVar31 = uVar31 + 1;
      uVar29 = uVar20;
    } while (uVar20 != uVar31);
    puVar16 = puVar16 + uVar29;
  }
  uVar20 = (long)puVar16 - (long)puVar34;
LAB_00313e00:
  if ((uVar20 < 4) || (uVar31 = uVar20 * 0x87 + 0x78f, uVar31 < 0x7e5)) {
LAB_00313e33:
    local_110 = 0;
  }
  else {
    uVar37 = puVar2[uVar20];
    uVar27 = uVar20;
    local_120 = uVar31;
    local_110 = uVar19;
  }
  uVar13 = (uint)((ulong)(*(long *)(ringbuffer + (uVar28 & ringbuffer_mask)) * -0x1ca5842ca8642d00)
                 >> 0x2c);
  lVar21 = 0;
  lVar33 = 0;
  lVar17 = 1;
  do {
    auStack_58[lVar21] = lVar33 * 8 + (ulong)uVar13 & 0xfffff;
    auStack_58[lVar21 + 1] = lVar17 * 8 + (ulong)uVar13 & 0xfffff;
    lVar21 = lVar21 + 2;
    lVar33 = lVar33 + 2;
    lVar17 = lVar17 + 2;
  } while (lVar21 != 4);
  lVar33 = 0;
LAB_00313e9e:
  uVar13 = *(uint *)(sVar8 + auStack_58[lVar33] * 4);
  puVar34 = ringbuffer + (uVar11 & uVar13);
  if (((uVar37 == puVar34[uVar27]) && (uVar28 != uVar13)) &&
     (uVar20 = uVar28 - uVar13, uVar20 <= uVar36)) {
    uVar31 = uVar30;
    puVar42 = puVar34;
    puVar16 = puVar2;
    if (7 < uVar30) {
      lVar21 = 0;
      lVar17 = 0;
LAB_00313eea:
      if (*(ulong *)(puVar2 + lVar21) == *(ulong *)(puVar34 + lVar21)) goto code_r0x00313ef7;
      uVar29 = *(ulong *)(puVar34 + lVar21) ^ *(ulong *)(puVar2 + lVar21);
      uVar31 = 0;
      if (uVar29 != 0) {
        for (; (uVar29 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
        }
      }
      uVar31 = (uVar31 >> 3 & 0x1fffffff) - lVar17;
      goto LAB_00313f73;
    }
    goto LAB_00313f21;
  }
  goto LAB_00313fa7;
code_r0x00313ef7:
  lVar21 = lVar21 + 8;
  lVar3 = lVar25 + lVar17;
  lVar17 = lVar17 + -8;
  if (lVar3 - 8U < 8) goto code_r0x00313f0d;
  goto LAB_00313eea;
code_r0x00313f0d:
  puVar42 = puVar34 + -lVar17;
  puVar16 = puVar2 + -lVar17;
  uVar31 = lVar17 + lVar25;
LAB_00313f21:
  if (uVar31 != 0) {
    uVar29 = 0;
    do {
      uVar9 = uVar29;
      if (puVar42[uVar29] != puVar16[uVar29]) break;
      uVar29 = uVar29 + 1;
      uVar9 = uVar31;
    } while (uVar31 != uVar29);
    puVar42 = puVar42 + uVar9;
  }
  uVar31 = (long)puVar42 - (long)puVar34;
LAB_00313f73:
  if (3 < uVar31) {
    iVar40 = 0x1f;
    if ((uint)uVar20 != 0) {
      for (; (uint)uVar20 >> iVar40 == 0; iVar40 = iVar40 + -1) {
      }
    }
    uVar29 = (ulong)(iVar40 * -0x1e + 0x780) + uVar31 * 0x87;
    if (local_120 < uVar29) {
      uVar37 = puVar2[uVar31];
      uVar27 = uVar31;
      local_120 = uVar29;
      local_110 = uVar20;
    }
  }
LAB_00313fa7:
  lVar33 = lVar33 + 1;
  if (lVar33 == 4) goto code_r0x00313fb4;
  goto LAB_00313e9e;
code_r0x00313fb4:
  *(uint *)(sVar8 + *(long *)((long)auStack_58 + (ulong)((uint)uVar28 & 0x18)) * 4) = (uint)uVar28;
  uVar36 = uVar22;
  uVar20 = local_128;
  if ((local_120 < local_f8 + 0xaf) ||
     (local_d8 = local_110, uVar36 = uVar28, uVar26 = uVar27, uVar20 = uVar39, iVar32 == 3))
  goto LAB_003140ec;
  local_128 = local_128 + 1;
  iVar32 = iVar32 + 1;
  uVar27 = uVar22 + 9;
  lVar25 = lVar25 + -1;
  local_f8 = local_120;
  uVar22 = uVar28;
  uVar20 = local_128;
  if (uVar1 <= uVar27) goto LAB_003140ec;
  goto LAB_00313d04;
LAB_003140ec:
  local_128 = uVar20;
  uVar22 = lVar6 + uVar36;
  if (uVar35 <= lVar6 + uVar36) {
    uVar22 = uVar35;
  }
  iVar40 = (int)uVar26;
  iVar32 = (int)local_128;
  if (uVar22 + lVar7 < local_d8) {
LAB_00314119:
    uVar30 = local_d8 + 0xf;
LAB_0031411d:
    if ((local_d8 <= uVar22 + lVar7) && (uVar30 != 0)) {
      *(undefined4 *)((long)(hasher->common).extra + 0xc) =
           *(undefined4 *)((hasher->common).extra + 1);
      *(void **)((long)(hasher->common).extra + 4) = (hasher->common).extra[0];
      *(int *)(hasher->common).extra = (int)local_d8;
    }
    *(int *)local_118 = iVar32;
    *(int *)((long)local_118 + 4) = iVar40;
    uVar22 = (ulong)*(uint *)(literal_context_lut + 0x3c) + 0x10;
    iVar14 = 0;
    if (uVar22 <= uVar30) {
      bVar23 = (byte)*(uint *)(literal_context_lut + 0x38);
      uVar19 = ((4L << (bVar23 & 0x3f)) + (uVar30 - *(uint *)(literal_context_lut + 0x3c))) - 0x10;
      uVar13 = 0x1f;
      uVar24 = (uint)uVar19;
      if (uVar24 != 0) {
        for (; uVar24 >> uVar13 == 0; uVar13 = uVar13 - 1) {
        }
      }
      uVar13 = (uVar13 ^ 0xffffffe0) + 0x1f;
      uVar39 = (ulong)((uVar19 >> ((ulong)uVar13 & 0x3f) & 1) != 0);
      lVar25 = (ulong)uVar13 - (ulong)*(uint *)(literal_context_lut + 0x38);
      uVar30 = (~(-1 << (bVar23 & 0x1f)) & uVar24) + uVar22 +
               (uVar39 + lVar25 * 2 + 0xfffe << (bVar23 & 0x3f)) | lVar25 * 0x400;
      iVar14 = (int)(uVar19 - (uVar39 + 2 << ((byte)uVar13 & 0x3f)) >> (bVar23 & 0x3f));
    }
    uVar13 = (uint)uVar30;
  }
  else {
    uVar19 = (ulong)*(int *)(hasher->common).extra;
    if (local_d8 != uVar19) {
      uVar39 = (ulong)*(int *)((long)(hasher->common).extra + 4);
      uVar30 = 1;
      if (local_d8 != uVar39) {
        uVar19 = (local_d8 + 3) - uVar19;
        if (uVar19 < 7) {
          bVar23 = (byte)((int)uVar19 << 2);
          uVar13 = 0x9750468;
        }
        else {
          uVar39 = (local_d8 + 3) - uVar39;
          if (6 < uVar39) {
            uVar30 = 2;
            if ((local_d8 != (long)*(int *)((hasher->common).extra + 1)) &&
               (uVar30 = 3, local_d8 != (long)*(int *)((long)(hasher->common).extra + 0xc)))
            goto LAB_00314119;
            goto LAB_0031411d;
          }
          bVar23 = (byte)((int)uVar39 << 2);
          uVar13 = 0xfdb1ace;
        }
        uVar30 = (ulong)(uVar13 >> (bVar23 & 0x1f) & 0xf);
      }
      goto LAB_0031411d;
    }
    *(int *)local_118 = iVar32;
    *(int *)((long)local_118 + 4) = iVar40;
    uVar13 = 0;
    iVar14 = 0;
  }
  *(short *)((long)local_118 + 0xe) = (short)uVar13;
  *(int *)(local_118 + 1) = iVar14;
  if (local_128 < 6) {
    uVar22 = local_128 & 0xffffffff;
  }
  else if (local_128 < 0x82) {
    uVar24 = 0x1f;
    uVar15 = (uint)(local_128 - 2);
    if (uVar15 != 0) {
      for (; uVar15 >> uVar24 == 0; uVar24 = uVar24 - 1) {
      }
    }
    uVar22 = (ulong)((int)(local_128 - 2 >> ((char)(uVar24 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                     (uVar24 ^ 0xffffffe0) * 2 + 0x40);
  }
  else if (local_128 < 0x842) {
    uVar24 = 0x1f;
    if (iVar32 - 0x42U != 0) {
      for (; iVar32 - 0x42U >> uVar24 == 0; uVar24 = uVar24 - 1) {
      }
    }
    uVar22 = (ulong)((uVar24 ^ 0xffe0) + 0x2a);
  }
  else {
    uVar22 = 0x15;
    if (0x1841 < local_128) {
      uVar22 = (ulong)(ushort)(0x17 - (local_128 < 0x5842));
    }
  }
  uVar19 = (ulong)iVar40;
  if (uVar19 < 10) {
    uVar24 = iVar40 - 2;
  }
  else if (uVar19 < 0x86) {
    uVar24 = 0x1f;
    uVar15 = (uint)(uVar19 - 6);
    if (uVar15 != 0) {
      for (; uVar15 >> uVar24 == 0; uVar24 = uVar24 - 1) {
      }
    }
    uVar24 = (int)(uVar19 - 6 >> ((char)(uVar24 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
             (uVar24 ^ 0xffffffe0) * 2 + 0x42;
  }
  else {
    uVar24 = 0x17;
    if (uVar19 < 0x846) {
      uVar24 = 0x1f;
      if (iVar40 - 0x46U != 0) {
        for (; iVar40 - 0x46U >> uVar24 == 0; uVar24 = uVar24 - 1) {
        }
      }
      uVar24 = (uVar24 ^ 0xffe0) + 0x2c;
    }
  }
  uVar10 = (ushort)uVar24;
  uVar12 = (uVar10 & 7) + ((ushort)uVar22 & 7) * 8;
  if ((((uVar13 & 0x3ff) == 0) && ((ushort)uVar22 < 8)) && (uVar10 < 0x10)) {
    if (7 < uVar10) {
      uVar12 = uVar12 | 0x40;
    }
  }
  else {
    iVar32 = (int)((uVar22 & 0xffff) >> 3) * 3 + ((uVar24 & 0xffff) >> 3);
    uVar12 = uVar12 + ((ushort)(0x520d40 >> ((char)iVar32 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar32 * 0x40 + 0x40;
  }
  *(ushort *)((long)local_118 + 0xc) = uVar12;
  *num_commands = *num_commands + local_128;
  position = uVar26 + uVar36;
  uVar22 = sVar38;
  if (position < sVar38) {
    uVar22 = position;
  }
  uVar19 = uVar36 + 2;
  if (local_d8 < uVar26 >> 2) {
    uVar30 = position + local_d8 * -4;
    if (uVar30 < uVar19) {
      uVar30 = uVar19;
    }
    uVar19 = uVar30;
    if (uVar22 < uVar30) {
      uVar19 = uVar22;
    }
  }
  local_120 = uVar36 + lVar41 + uVar26 * 2;
  local_118 = local_118 + 2;
  if (uVar19 < uVar22) {
    do {
      *(uint *)(sVar8 + (ulong)((uint)((ulong)(*(long *)(ringbuffer + (uVar19 & ringbuffer_mask)) *
                                              -0x1ca5842ca8642d00) >> 0x2c) + ((uint)uVar19 & 0x18)
                               & 0xfffff) * 4) = (uint)uVar19;
      uVar19 = uVar19 + 1;
    } while (uVar22 != uVar19);
  }
  local_128 = 0;
LAB_0031445d:
  uVar22 = position;
  if (uVar1 <= position + 8) goto LAB_003144c6;
  goto LAB_00313a21;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}